

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintFactor(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pNode_00;
  char *pcVar2;
  uint local_40;
  int fUseRealNames;
  int c;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_40 = 1;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"nh"), iVar1 != -1) {
    if ((iVar1 == 0x68) || (iVar1 != 0x6e)) goto LAB_002268a0;
    local_40 = local_40 ^ 1;
  }
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar1 = Abc_NtkIsSopLogic(pNtk_00);
    if (iVar1 == 0) {
      Abc_Print(-1,"Printing factored forms can be done for SOP networks.\n");
      pAbc_local._4_4_ = 1;
    }
    else if (globalUtilOptind + 1 < argc) {
      Abc_Print(-1,"Wrong number of auguments.\n");
LAB_002268a0:
      Abc_Print(-2,"usage: print_factor [-nh] <node>\n");
      Abc_Print(-2,"\t        prints the factored forms of nodes\n");
      pcVar2 = "dummy";
      if (local_40 != 0) {
        pcVar2 = "real";
      }
      Abc_Print(-2,"\t-n    : toggles real/dummy fanin names [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      Abc_Print(-2,"\tnode  : (optional) one node to consider\n");
      pAbc_local._4_4_ = 1;
    }
    else if (argc == globalUtilOptind + 1) {
      pNode_00 = Abc_NtkFindNode(pNtk_00,argv[globalUtilOptind]);
      if (pNode_00 == (Abc_Obj_t *)0x0) {
        Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_NodePrintFactor(_stdout,pNode_00,local_40);
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      Abc_NtkPrintFactor(_stdout,pNtk_00,local_40);
      pAbc_local._4_4_ = 0;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandPrintFactor( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    int fUseRealNames;

    // set defaults
    fUseRealNames = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fUseRealNames ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Printing factored forms can be done for SOP networks.\n" );
        return 1;
    }

    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
        Abc_NodePrintFactor( stdout, pNode, fUseRealNames );
        return 0;
    }
    // print the nodes
    Abc_NtkPrintFactor( stdout, pNtk, fUseRealNames );
    return 0;

usage:
    Abc_Print( -2, "usage: print_factor [-nh] <node>\n" );
    Abc_Print( -2, "\t        prints the factored forms of nodes\n" );
    Abc_Print( -2, "\t-n    : toggles real/dummy fanin names [default = %s]\n", fUseRealNames? "real": "dummy" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tnode  : (optional) one node to consider\n");
    return 1;
}